

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::editDeletePreviousWord(Cmd *this,State *state)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  
  sVar2 = state->pos;
  lVar4 = 0;
  for (lVar3 = -1;
      (sVar5 = sVar2 - lVar4, sVar5 != 0 &&
      (sVar1 = sVar2 + lVar3, (state->buf)._M_dataplus._M_p[sVar1] == ' ')); lVar3 = lVar3 + -1) {
    state->pos = sVar1;
    lVar4 = lVar4 + 1;
  }
  while ((sVar5 != 0 && ((state->buf)._M_dataplus._M_p[sVar5 - 1] != ' '))) {
    state->pos = sVar5 - 1;
    sVar5 = sVar5 - 1;
  }
  std::__cxx11::string::erase((ulong)state,sVar5);
  refreshLine(this,state);
  return;
}

Assistant:

void editDeletePreviousWord(State *state) {
		const size_t old_pos = state->pos;

		while (state->pos > 0 && state->buf[state->pos - 1] == ' ')
			state->pos--;

		while (state->pos > 0 && state->buf[state->pos - 1] != ' ')
			state->pos--;

		const size_t diff = old_pos - state->pos;
		state->buf.erase(state->pos, diff);
		refreshLine(state);
	}